

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
hedg::utils::get_ids
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,
          queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
          *market_ids,
          deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          *subscribed,int max_markets)

{
  _Elt_pointer ppVar1;
  _Elt_pointer ppVar2;
  int iVar3;
  bool bVar4;
  string id_string;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  if ((market_ids->c).
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (market_ids->c).
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar3 = 0;
  }
  else {
    std::__cxx11::string::append((char *)&local_58);
    std::__cxx11::string::_M_append
              ((char *)&local_58,
               (ulong)(((market_ids->c).
                        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->first)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_58);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::push_back(subscribed,
                (market_ids->c).
                super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
    ::pop_front(&market_ids->c);
    ppVar1 = (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar2 = (market_ids->c).
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVar2 == ppVar1) {
      iVar3 = 1;
    }
    else {
      local_38 = __return_storage_ptr__;
      if (max_markets != 1) {
        iVar3 = 2;
        do {
          std::__cxx11::string::append((char *)&local_58);
          std::__cxx11::string::append((char *)&local_58);
          std::__cxx11::string::_M_append
                    ((char *)&local_58,
                     (ulong)(((market_ids->c).
                              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->first)._M_dataplus.
                            _M_p);
          std::__cxx11::string::append((char *)&local_58);
          std::
          deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ::push_back(subscribed,
                      (market_ids->c).
                      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur);
          std::
          deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ::pop_front(&market_ids->c);
          ppVar1 = (market_ids->c).
                   super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          ppVar2 = (market_ids->c).
                   super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          __return_storage_ptr__ = local_38;
          if (ppVar2 == ppVar1) goto LAB_00173ecf;
          bVar4 = iVar3 != max_markets;
          iVar3 = iVar3 + 1;
        } while (bVar4);
      }
      __return_storage_ptr__ = local_38;
      iVar3 = max_markets;
      if (ppVar2 != ppVar1) {
        do {
          std::
          deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
          ::pop_front(&market_ids->c);
        } while ((market_ids->c).
                 super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                 (market_ids->c).
                 super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur);
      }
    }
  }
LAB_00173ecf:
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_58,local_58 + local_50);
  __return_storage_ptr__->second = iVar3;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::system_error vsystem_error(int error_code, string_view format_str,
                                         format_args args) {
  auto ec = std::error_code(error_code, std::generic_category());
  return std::system_error(ec, vformat(format_str, args));
}